

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

uint processorstop(logdir *ld)

{
  char *from;
  int iVar1;
  uint uVar2;
  char f [28];
  char local_58 [26];
  undefined2 local_3e;
  
  if (ld->ppid != 0) {
    sig_unblock(sig_hangup);
    iVar1 = wait_pid(&wstat,ld->ppid);
    while (iVar1 == -1) {
      strerr_warn("svlogd: pausing: ","error waiting for processor",": ",ld->name,": ",(char *)0x0,
                  &strerr_sys);
      sleep(3);
      iVar1 = wait_pid(&wstat,ld->ppid);
    }
    sig_block(sig_hangup);
    ld->ppid = 0;
  }
  uVar2 = 1;
  if (ld->fddir != -1) {
    iVar1 = fchdir(ld->fddir);
    while (iVar1 == -1) {
      strerr_warn("svlogd: pausing: ","unable to change directory, want processor",": ",ld->name,
                  ": ",(char *)0x0,&strerr_sys);
      sleep(3);
      iVar1 = fchdir(ld->fddir);
    }
    if ((uint)wstat < 0x100) {
      from = ld->fnsave;
      ld->fnsave[0x1a] = 't';
      byte_copy(local_58,0x1a,from);
      local_3e = 0x73;
      iVar1 = rename(from,local_58);
      if (iVar1 == -1) {
        do {
          strerr_warn("svlogd: pausing: ","unable to rename processed",": ",ld->name,": ",
                      (char *)0x0,&strerr_sys);
          sleep(3);
          iVar1 = rename(from,local_58);
        } while (iVar1 == -1);
      }
      iVar1 = chmod(local_58,0x1e4);
      if (iVar1 == -1) {
        do {
          strerr_warn("svlogd: pausing: ","unable to set mode of processed",": ",ld->name,": ",
                      (char *)0x0,&strerr_sys);
          sleep(3);
          iVar1 = chmod(local_58,0x1e4);
        } while (iVar1 == -1);
      }
      ld->fnsave[0x1a] = 'u';
      iVar1 = unlink(from);
      if (iVar1 == -1) {
        strerr_warn("svlogd: warning: ","unable to unlink: ",ld->name,"/",from,(char *)0x0,
                    (strerr *)0x0);
      }
      iVar1 = rename("newstate","state");
      while (iVar1 == -1) {
        strerr_warn("svlogd: pausing: ","unable to rename state",": ",ld->name,": ",(char *)0x0,
                    &strerr_sys);
        sleep(3);
        iVar1 = rename("newstate","state");
      }
      if (verbose != 0) {
        strerr_warn("svlogd: info: ","processed: ",ld->name,"/",local_58,(char *)0x0,(strerr *)0x0);
      }
      iVar1 = fchdir(fdwdir);
      uVar2 = 1;
      while (iVar1 == -1) {
        strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
        sleep(3);
        iVar1 = fchdir(fdwdir);
      }
    }
    else {
      strerr_warn("svlogd: warning: ","processor failed, restart",": ",ld->name,(char *)0x0,
                  (char *)0x0,(strerr *)0x0);
      ld->fnsave[0x1a] = 't';
      unlink(ld->fnsave);
      ld->fnsave[0x1a] = 'u';
      processorstart(ld);
      iVar1 = fchdir(fdwdir);
      while (iVar1 == -1) {
        strerr_warn("svlogd: pausing: ","unable to change to initial working directory",": ",
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
        sleep(3);
        iVar1 = fchdir(fdwdir);
      }
      uVar2 = (uint)((ld->processor).len == 0);
    }
  }
  return uVar2;
}

Assistant:

unsigned int processorstop(struct logdir *ld) {
  char f[28];

  if (ld->ppid) {
    sig_unblock(sig_hangup);
    while (wait_pid(&wstat, ld->ppid) == -1)
      pause2("error waiting for processor", ld->name);
    sig_block(sig_hangup);
    ld->ppid =0;
  }
  if (ld->fddir == -1) return(1);
  while (fchdir(ld->fddir) == -1)
    pause2("unable to change directory, want processor", ld->name);
  if (wait_exitcode(wstat) != 0) {
    warnx("processor failed, restart", ld->name);
    ld->fnsave[26] ='t';
    unlink(ld->fnsave);
    ld->fnsave[26] ='u';
    processorstart(ld);
    while (fchdir(fdwdir) == -1)
      pause1("unable to change to initial working directory");
    return(ld->processor.len ? 0 : 1);
  }
  ld->fnsave[26] ='t';
  byte_copy(f, 26, ld->fnsave);
  f[26] ='s'; f[27] =0;
  while (rename(ld->fnsave, f) == -1)
    pause2("unable to rename processed", ld->name);
  while (chmod(f, 0744) == -1)
    pause2("unable to set mode of processed", ld->name);
  ld->fnsave[26] ='u';
  if (unlink(ld->fnsave) == -1)
    strerr_warn5(WARNING, "unable to unlink: ", ld->name, "/", ld->fnsave, 0);
  while (rename("newstate", "state") == -1)
    pause2("unable to rename state", ld->name);
  if (verbose) strerr_warn5(INFO, "processed: ", ld->name, "/", f, 0);
  while (fchdir(fdwdir) == -1)
    pause1("unable to change to initial working directory");
  return(1);
}